

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgQuaternion.cpp
# Opt level: O1

void __thiscall dgQuaternion::dgQuaternion(dgQuaternion *this,dgVector *unitAxis,HaF32 Angle)

{
  float fVar1;
  
  fVar1 = cosf((float)Angle * 0.5);
  this->m_q0 = (HaF32)fVar1;
  fVar1 = sinf((float)Angle * 0.5);
  this->m_q1 = (HaF32)(fVar1 * (unitAxis->super_dgTemplateVector<float>).m_x);
  this->m_q2 = (HaF32)(fVar1 * (unitAxis->super_dgTemplateVector<float>).m_y);
  this->m_q3 = (HaF32)(fVar1 * (unitAxis->super_dgTemplateVector<float>).m_z);
  return;
}

Assistant:

dgQuaternion::dgQuaternion (const dgVector &unitAxis, hacd::HaF32 Angle)
{
	hacd::HaF32 sinAng;

	Angle *= hacd::HaF32 (0.5f);
	m_q0 = dgCos (Angle);
	sinAng = dgSin (Angle);

#ifdef _DEBUG
	if (dgAbsf (Angle) > hacd::HaF32(dgEPSILON / 10.0f)) {
		HACD_ASSERT (dgAbsf (hacd::HaF32(1.0f) - unitAxis % unitAxis) < hacd::HaF32(dgEPSILON * 10.0f));
	} 
#endif
	m_q1 = unitAxis.m_x * sinAng;
	m_q2 = unitAxis.m_y * sinAng;
	m_q3 = unitAxis.m_z * sinAng;

}